

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

int Curl_pgrsDone(Curl_easy *data)

{
  int iVar1;
  
  (data->progress).lastshow = 0;
  iVar1 = Curl_pgrsUpdate(data);
  if (iVar1 == 0) {
    if ((((data->progress).flags & 0x10) == 0) && (((data->progress).field_0x184 & 1) == 0)) {
      curl_mfprintf((data->set).err,"\n");
    }
    (data->progress).speeder_c = 0;
  }
  return iVar1;
}

Assistant:

int Curl_pgrsDone(struct Curl_easy *data)
{
  int rc;
  data->progress.lastshow = 0;
  rc = Curl_pgrsUpdate(data); /* the final (forced) update */
  if(rc)
    return rc;

  if(!(data->progress.flags & PGRS_HIDE) &&
     !data->progress.callback)
    /* only output if we don't use a progress callback and we're not
     * hidden */
    fprintf(data->set.err, "\n");

  data->progress.speeder_c = 0; /* reset the progress meter display */
  return 0;
}